

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncDecVerify.cpp
# Opt level: O0

void incdec_verify::PostIncTestUint8(void)

{
  bool bVar1;
  SafeIntException *anon_var_0;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> vv;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  size_t i;
  allocator *in_stack_ffffffffffffffa0;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *this;
  allocator local_49;
  string local_48 [43];
  uchar local_1d;
  undefined1 in_stack_ffffffffffffffee;
  uchar in_stack_ffffffffffffffef;
  undefined5 in_stack_fffffffffffffff0;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  SVar2;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffff6;
  byte bVar3;
  ulong local_8;
  
  for (local_8 = 0; local_8 < 9; local_8 = local_8 + 1) {
    bVar3 = 1;
    this = (SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
            *)&stack0xfffffffffffffff6;
    SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(this,inc_uint8 + local_8 * 3);
    local_1d = (uchar)SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      ::operator++(this,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
    SVar2 = (SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             )local_1d;
    bVar1 = operator!=((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )0x0,'\0');
    if (bVar1) {
      bVar3 = 0;
    }
    if ((bVar3 & 1) != (inc_uint8[local_8 * 3 + 2] & 1)) {
      in_stack_ffffffffffffffa0 = &local_49;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_48,"Error in case inc_uint8 throw (2): ",in_stack_ffffffffffffffa0);
      err_msg<unsigned_char>
                ((string *)
                 CONCAT17(bVar3,CONCAT16(in_stack_fffffffffffffff6.m_int,
                                         CONCAT15(SVar2.m_int,in_stack_fffffffffffffff0))),
                 in_stack_ffffffffffffffef,(bool)in_stack_ffffffffffffffee);
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
    }
  }
  return;
}

Assistant:

void PostIncTestUint8()
{
	size_t i;

	for( i = 0; i < COUNTOF(inc_uint8); ++i )
	{
		bool fSuccess = true;
		try
		{
			SafeInt<std::uint8_t> si(inc_uint8[i].x);
			SafeInt<std::uint8_t> vv = si++;

			if(vv != inc_uint8[i].x)
			{
				fSuccess = false;
			}
		}
		catch(SafeIntException&)
		{
			fSuccess = false;
		}

		if( fSuccess != inc_uint8[i].fExpected )
		{
			err_msg( "Error in case inc_uint8 throw (2): ", inc_uint8[i].x, inc_uint8[i].fExpected );
		}
	}
}